

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

Number __thiscall LiteScript::Number::operator-(Number *this,Number *number)

{
  byte bVar1;
  float fVar2;
  char *in_RDX;
  float fVar3;
  
  fVar2 = (float)(number->value).integer;
  if (number->numeric_type == '\0' && *in_RDX == '\0') {
    fVar2 = (float)((int)fVar2 - *(int *)(in_RDX + 4));
    bVar1 = 0;
  }
  else {
    if (number->numeric_type == '\0') {
      fVar2 = (float)(int)fVar2;
    }
    fVar3 = *(float *)(in_RDX + 4);
    if (*in_RDX == '\0') {
      fVar3 = (float)(int)fVar3;
    }
    fVar2 = fVar2 - fVar3;
    fVar3 = roundf(fVar2);
    bVar1 = -(fVar3 != fVar2) & 1;
    if ((fVar3 == fVar2) && (!NAN(fVar3) && !NAN(fVar2))) {
      fVar2 = (float)(int)fVar2;
    }
  }
  this->numeric_type = bVar1;
  (this->value).integer = (int)fVar2;
  return (Number)this;
}

Assistant:

LiteScript::Number LiteScript::Number::operator-(const LiteScript::Number& number) const {
    if (this->numeric_type == 0 && number.numeric_type == 0)
        return Number(this->value.integer - number.value.integer);
    else
        return Number((float)*this - (float)number);
}